

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O1

int testSimpleNNShape(void)

{
  pointer pcVar1;
  int iVar2;
  ConvolutionLayerParams *pCVar3;
  long lVar4;
  bool bVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this;
  Type *this_00;
  InnerProductLayerParams *this_01;
  WeightParams *this_02;
  ostream *poVar10;
  uint uVar11;
  int iVar12;
  Model m1;
  NeuralNetworkShaper shapes;
  Result res;
  Model local_e0;
  undefined1 local_b0 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  local_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&local_e0);
  if (local_e0.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_e0.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_e0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_b0 + 0x10;
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  iVar12 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar9->shape_,iVar12 + 1);
  }
  iVar12 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar12 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar12] = 4;
  if (local_e0.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_e0.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_e0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  iVar12 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar9->shape_,iVar12 + 1);
  }
  iVar12 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar12 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar12] = 3;
  if (local_e0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_e0);
    local_e0._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_e0.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_e0.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x8c;
    this_01 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01);
    (this_00->layer_).innerproduct_ = this_01;
  }
  pCVar3 = (this_00->layer_).convolution_;
  *(undefined8 *)&pCVar3->_kernelsize_cached_byte_size_ = 4;
  (pCVar3->stride_).current_size_ = 3;
  (pCVar3->stride_).total_size_ = 0;
  iVar12 = 0xc;
  do {
    lVar4._0_4_ = (pCVar3->kernelsize_).current_size_;
    lVar4._4_4_ = (pCVar3->kernelsize_).total_size_;
    if (lVar4 == 0) {
      this_02 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(this_02);
      *(WeightParams **)&pCVar3->kernelsize_ = this_02;
    }
    lVar4 = *(long *)&pCVar3->kernelsize_;
    if (*(int *)(lVar4 + 0x10) == *(int *)(lVar4 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve
                ((RepeatedField<float> *)(lVar4 + 0x10),*(int *)(lVar4 + 0x14) + 1);
    }
    iVar2 = *(int *)(lVar4 + 0x10);
    *(int *)(lVar4 + 0x10) = iVar2 + 1;
    *(undefined4 *)(*(long *)(lVar4 + 0x18) + 8 + (long)iVar2 * 4) = 0x3f800000;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  *(undefined1 *)&(pCVar3->stride_).rep_ = 0;
  CoreML::validate<(MLModelType)500>(&local_48,&local_e0);
  bVar5 = CoreML::Result::good(&local_48);
  if (bVar5) {
    CoreML::NeuralNetworkShaper::NeuralNetworkShaper((NeuralNetworkShaper *)local_b0,&local_e0,true)
    ;
    bVar5 = CoreML::NeuralNetworkShaper::isValid((NeuralNetworkShaper *)local_b0);
    if (!bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x33);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"shapes.isValid()",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    uVar11 = (uint)!bVar5;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
    ::~_Rb_tree(&local_78);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 *)(local_b0 + 8));
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    uVar11 = 1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_e0);
  return uVar11;
}

Assistant:

int testSimpleNNShape() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(4);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(3);

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(4);
    innerProductParams->set_outputchannels(3);
    for (int i = 0; i < 12; i++) {
        innerProductParams->mutable_weights()->add_floatvalue(1.0);
    }

    innerProductParams->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    NeuralNetworkShaper shapes = NeuralNetworkShaper(m1);

    ML_ASSERT(shapes.isValid());

    return 0;

}